

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_product_relation.cpp
# Opt level: O1

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::CrossProductRelation::GetQueryNode(CrossProductRelation *this)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  undefined8 uVar2;
  SelectNode *this_00;
  pointer pSVar3;
  tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> this_01;
  pointer *__ptr;
  long *in_RSI;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_58;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_50
  ;
  undefined1 local_48 [32];
  
  this_00 = (SelectNode *)operator_new(0xf0);
  SelectNode::SelectNode(this_00);
  local_58._M_head_impl = this_00;
  pSVar3 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_58);
  this_01.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       )operator_new(0x110);
  local_48._8_8_ = 0;
  local_48[0x10] = '\0';
  local_48._0_8_ = (TableRef *)(local_48 + 0x10);
  StarExpression::StarExpression
            ((StarExpression *)
             this_01.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
             (string *)local_48);
  if ((TableRef *)local_48._0_8_ != (TableRef *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  local_50._M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
       this_01.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar3->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_50);
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_50._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_50._M_t.
                          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 8
                ))();
  }
  (**(code **)(*in_RSI + 0x38))(local_48);
  pSVar3 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_58);
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (long *)0x0;
  _Var1._M_head_impl =
       (pSVar3->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar3->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar2;
  if (_Var1._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
  }
  if ((long *)local_48._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_48._0_8_ + 8))();
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> CrossProductRelation::GetQueryNode() {
	auto result = make_uniq<SelectNode>();
	result->select_list.push_back(make_uniq<StarExpression>());
	result->from_table = GetTableRef();
	return std::move(result);
}